

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

void Ivy_ManStopFanout(Ivy_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  if (p->fFanout != 0) {
    p->fFanout = 0;
    for (local_1c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
      pvVar2 = Vec_PtrEntry(p->vObjs,local_1c);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + 0x40) = 0;
        *(undefined8 *)((long)pvVar2 + 0x38) = 0;
        *(undefined8 *)((long)pvVar2 + 0x30) = 0;
        *(undefined8 *)((long)pvVar2 + 0x28) = 0;
        *(undefined8 *)((long)pvVar2 + 0x20) = 0;
      }
    }
    return;
  }
  __assert_fail("p->fFanout",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                ,0xa6,"void Ivy_ManStopFanout(Ivy_Man_t *)");
}

Assistant:

void Ivy_ManStopFanout( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->fFanout );
    p->fFanout = 0;
    Ivy_ManForEachObj( p, pObj, i )
        pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
}